

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvrktest.cpp
# Opt level: O2

Result TestPowerAmplifier(AmpIO **Board,BasePort *Port)

{
  bool bVar1;
  Result RVar2;
  uint32_t uVar3;
  ostream *poVar4;
  uint index;
  char *pcVar5;
  char *pcVar6;
  int board_index;
  int iVar7;
  long lVar8;
  ulong uVar9;
  Result local_68;
  int local_64;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  char *local_58;
  ulong uStack_50;
  AmpIO **local_40;
  ulong local_38;
  
  lVar8 = 0;
  local_68 = pass;
  local_64 = 0;
  local_40 = Board;
  do {
    if (NUM_FPGA <= lVar8) {
      if (local_64 == 2) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"(DB9 cables are likely crossed!)");
        poVar4 = std::operator<<(poVar4,(string *)&COLOR_OFF_abi_cxx11_);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar6 = "DB9 cables are likely crossed!";
LAB_00107225:
        poVar4 = std::operator<<((ostream *)&logfile,pcVar6);
        RVar2 = fatal_fail;
      }
      else {
        if (local_68 != fail) {
          return local_68;
        }
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"(Are the DB9 cables plugged in?)");
        poVar4 = std::operator<<(poVar4,(string *)&COLOR_OFF_abi_cxx11_);
        RVar2 = fail;
      }
      std::endl<char,std::char_traits<char>>(poVar4);
      return RVar2;
    }
    index = 0;
    while( true ) {
      if (((NUM_CHANNEL_PER_FPGA <= (int)index) || (lVar8 == 1 && index == 3)) ||
         (lVar8 == 0 && index == 7)) break;
      (*Port->_vptr_BasePort[0x1d])(Port);
      uVar3 = AmpIO::GetAnalogInput(*Board,0);
      uVar9 = 0;
      if (ABS((double)(long)((ulong)uVar3 - 0x2000)) < 1280.0) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)&COLOR_ERROR_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"(unexpected current detected on channel 0)");
        poVar4 = std::operator<<(poVar4,(string *)&COLOR_OFF_abi_cxx11_);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar6 = "unexpected current detected on channel 0";
        goto LAB_00107225;
      }
      AmpIO::SetMotorCurrent(Board[lVar8],index,0x8500);
      (*Port->_vptr_BasePort[0x21])(Port);
      local_60.__r = 200;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_60);
      (*Port->_vptr_BasePort[0x1d])(Port);
      uVar3 = AmpIO::GetMotorCurrent(Board[lVar8],index);
      local_38 = (ulong)uVar3;
      local_58 = (char *)ABS((double)(long)(local_38 - 0x8500));
      uStack_50 = uVar9 & 0x7fffffffffffffff;
      uVar3 = AmpIO::GetAnalogInput(*Board,0);
      bVar1 = ABS((double)(long)((ulong)uVar3 - 0x2000)) < 1280.0;
      iVar7 = (int)lVar8;
      pcVar6 = " ... \x1b[0;32m[PASS]\x1b[0m";
      if (512.0 <= (double)local_58) {
        pcVar6 = " ... \x1b[1;91m[FAIL]\x1b[0m";
      }
      pcVar5 = "... PASS";
      if (512.0 <= (double)local_58) {
        pcVar5 = "... FAIL";
        local_68 = fail;
      }
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      local_64 = local_64 +
                 (uint)(((index == 0 && lVar8 == 1) && (double)local_58 < 512.0) && bVar1) +
                 (uint)(((double)local_58 < 512.0 && (index == 0 && iVar7 == 0)) && !bVar1) +
                 (uint)(((index == 4 && lVar8 == 0) && (double)local_58 < 512.0) && bVar1);
      local_58 = pcVar5;
      poVar4 = std::operator<<((ostream *)&std::cout,"board ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
      poVar4 = std::operator<<(poVar4," amp channel ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,index);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = std::operator<<(poVar4," expected=");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," measured=");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      *(uint *)(&DAT_001234b0 + *(long *)(logfile + -0x18)) =
           *(uint *)(&DAT_001234b0 + *(long *)(logfile + -0x18)) & 0xffffffb5 | 8;
      poVar4 = std::operator<<((ostream *)&logfile,"board ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
      poVar4 = std::operator<<(poVar4," amp channel ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,index);
      poVar4 = std::operator<<(poVar4," - ");
      poVar4 = std::operator<<(poVar4," expected=");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," measured=");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      Board = local_40;
      poVar4 = std::operator<<((ostream *)&std::cout,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&logfile,local_58);
      std::endl<char,std::char_traits<char>>(poVar4);
      AmpIO::SetMotorCurrent(Board[lVar8],index,0x8000);
      (*Port->_vptr_BasePort[0x21])(Port);
      local_60.__r = 200;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_60);
      index = index + 1;
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

Result TestPowerAmplifier(AmpIO **Board, BasePort *Port) {
    int crossed_db9_error_count = 0;
    Result result = pass;

    for (int board_index = 0; board_index < NUM_FPGA; board_index++) {
        for (int channel_index = 0; channel_index < NUM_CHANNEL_PER_FPGA; channel_index++) {
            if (board_index == 1 && channel_index == 3) break;
            if (board_index == 0 && channel_index == 7) break;

            Port->ReadAllBoards();

            if (std::fabs((long) Board[0]->GetAnalogInput(0) - (long) POT_TEST_ADC_COUNT[0] / 2) <
                POT_TEST_ADC_ERROR_TOLERANCE) {
                std::cout << COLOR_ERROR << "(unexpected current detected on channel 0)" << COLOR_OFF << std::endl;
                logfile << "unexpected current detected on channel 0" << std::endl;
                return fatal_fail;
            }

            Board[board_index]->SetMotorCurrent(channel_index, POWER_AMP_TEST_DAC);
            Port->WriteAllBoards();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));

            Port->ReadAllBoards();
            auto motor_current = Board[board_index]->GetMotorCurrent(channel_index);
            bool amp_working = std::fabs((long) motor_current - (long) POWER_AMP_TEST_DAC) <
                               POWER_AMP_TEST_TOLERANCE;
            bool channel_0_load_driven =
                    std::fabs((long) Board[0]->GetAnalogInput(0) - (long) POT_TEST_ADC_COUNT[0] / 2) <
                    POT_TEST_ADC_ERROR_TOLERANCE;

            if (board_index == 0 && channel_index == 0 && amp_working && !channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            if (board_index == 1 && channel_index == 0 && amp_working && channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            if (board_index == 0 && channel_index == 4 && amp_working && channel_0_load_driven) {
                crossed_db9_error_count++;
            }

            std::cout << std::hex << "board " << board_index << " amp channel " << channel_index << " - "
                      << " expected="
                      << POWER_AMP_TEST_DAC << " measured=" << motor_current;
            logfile << std::hex << "board " << board_index << " amp channel " << channel_index << " - "
                        << " expected="
                        << POWER_AMP_TEST_DAC << " measured=" << motor_current;

            if (!amp_working) {
                result = fail;
                std::cout << FAIL << std::endl;
                logfile << "... FAIL" << std::endl;
            } else {
                std::cout << PASS << std::endl;
                logfile << "... PASS" << std::endl;
            }

            Board[board_index]->SetMotorCurrent(channel_index, 0x8000);
            Port->WriteAllBoards();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));


        }
    }
    if (crossed_db9_error_count == 2) {
        result = fatal_fail;
        std::cout << COLOR_ERROR << "(DB9 cables are likely crossed!)" << COLOR_OFF << std::endl;
        logfile << "DB9 cables are likely crossed!" << std::endl;
    }

    if (result == fail) {
        std::cout << COLOR_ERROR << "(Are the DB9 cables plugged in?)" << COLOR_OFF << std::endl;
    }

    return result;

}